

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleField.cpp
# Opt level: O0

void __thiscall DoubleField::DoubleField(DoubleField *this,string *name,int size)

{
  DoubleElement *pDVar1;
  int local_50;
  int i;
  string local_40;
  int local_1c;
  string *psStack_18;
  int size_local;
  string *name_local;
  DoubleField *this_local;
  
  local_1c = size;
  psStack_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Tag::Tag(&this->super_Tag,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Tag).super_StreamObject._vptr_StreamObject = (_func_int **)&PTR_write_00111d48;
  if (local_1c == 0) {
    pDVar1 = (DoubleElement *)operator_new(0x48);
    DoubleElement::DoubleElement(pDVar1);
    Tag::addElement(&this->super_Tag,(StreamObject *)pDVar1);
  }
  else {
    for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
      pDVar1 = (DoubleElement *)operator_new(0x48);
      DoubleElement::DoubleElement(pDVar1);
      Tag::addElement(&this->super_Tag,(StreamObject *)pDVar1);
    }
  }
  (this->super_Tag)._lineSize = 1;
  (this->super_Tag)._numberOfLines = local_1c;
  return;
}

Assistant:

DoubleField::DoubleField( std::string name, int size ) : Tag( name )
{
	// we have to add at least one element
	if ( size == 0 )
	{
		addElement( new DoubleElement() );
	}
	else
	{
		for ( int i = 0; i < size; i++ )
		{
			addElement( new DoubleElement() );
		}
	}
	// We want to treat each element
	// as seperate line
	_lineSize = 1;
	_numberOfLines = size;
}